

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O3

int archive_write_pax_free(archive_write *a)

{
  void *__ptr;
  undefined8 *__ptr_00;
  
  __ptr = a->format_data;
  if (__ptr != (void *)0x0) {
    archive_string_free((archive_string *)((long)__ptr + 0x28));
    archive_string_free((archive_string *)((long)__ptr + 0x40));
    archive_string_free((archive_string *)((long)__ptr + 0x10));
    while (__ptr_00 = *(undefined8 **)((long)__ptr + 0x60), __ptr_00 != (undefined8 *)0x0) {
      *(undefined8 *)((long)__ptr + 0x60) = *__ptr_00;
      free(__ptr_00);
    }
    free(__ptr);
    a->format_data = (void *)0x0;
  }
  return 0;
}

Assistant:

static int
archive_write_pax_free(struct archive_write *a)
{
	struct pax *pax;

	pax = (struct pax *)a->format_data;
	if (pax == NULL)
		return (ARCHIVE_OK);

	archive_string_free(&pax->pax_header);
	archive_string_free(&pax->sparse_map);
	archive_string_free(&pax->l_url_encoded_name);
	sparse_list_clear(pax);
	free(pax);
	a->format_data = NULL;
	return (ARCHIVE_OK);
}